

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O2

size_t entt::next_power_of_two(size_t value)

{
  int next;
  uint uVar1;
  ulong uVar2;
  
  if (-1 < (long)value) {
    uVar2 = (value - 1) + (ulong)(value == 0);
    for (uVar1 = 1; uVar1 < 0x40; uVar1 = uVar1 * 2) {
      uVar2 = uVar2 | uVar2 >> ((byte)uVar1 & 0x3f);
    }
    return uVar2 + 1;
  }
  __assert_fail("value < (std::size_t{1u} << (std::numeric_limits<std::size_t>::digits - 1))",
                "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/entt/./single_include/entt/entt.hpp"
                ,0x4ca,"std::size_t entt::next_power_of_two(const std::size_t)");
}

Assistant:

[[nodiscard]] inline constexpr std::size_t next_power_of_two(const std::size_t value) ENTT_NOEXCEPT {
    ENTT_ASSERT(value < (std::size_t{1u} << (std::numeric_limits<std::size_t>::digits - 1)), "Numeric limits exceeded");
    std::size_t curr = value - (value != 0u);

    for(int next = 1; next < std::numeric_limits<std::size_t>::digits; next = next * 2) {
        curr |= curr >> next;
    }

    return ++curr;
}